

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O1

void Ses_ManCleanLight(Ses_Man_t *pSes)

{
  int *piVar1;
  int iVar2;
  uint uVar3;
  word *pwVar4;
  int *piVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  
  iVar2 = pSes->nSpecFunc;
  if (0 < (long)iVar2) {
    uVar3 = pSes->bSpecInv;
    iVar7 = 0;
    lVar8 = 0;
    do {
      if ((uVar3 >> ((uint)lVar8 & 0x1f) & 1) != 0) {
        pwVar4 = pSes->pSpec;
        lVar9 = 0;
        do {
          pwVar4[iVar7 + lVar9] = ~pwVar4[iVar7 + lVar9];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 4);
      }
      lVar8 = lVar8 + 1;
      iVar7 = iVar7 + 4;
    } while (lVar8 != iVar2);
  }
  piVar5 = pSes->pArrTimeProfile;
  if ((piVar5 != (int *)0x0) && (0 < pSes->nSpecVars)) {
    lVar8 = 0;
    do {
      piVar1 = piVar5 + lVar8;
      *piVar1 = *piVar1 + pSes->nArrTimeDelta;
      lVar8 = lVar8 + 1;
    } while (lVar8 < pSes->nSpecVars);
  }
  pVVar6 = pSes->vPolar;
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  if (pVVar6 != (Vec_Int_t *)0x0) {
    free(pVVar6);
  }
  pVVar6 = pSes->vAssump;
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  if (pVVar6 != (Vec_Int_t *)0x0) {
    free(pVVar6);
  }
  pVVar6 = pSes->vStairDecVars;
  if (pVVar6->pArray != (int *)0x0) {
    free(pVVar6->pArray);
    pVVar6->pArray = (int *)0x0;
  }
  if (pVVar6 != (Vec_Int_t *)0x0) {
    free(pVVar6);
  }
  if (pSes != (Ses_Man_t *)0x0) {
    free(pSes);
    return;
  }
  return;
}

Assistant:

static inline void Ses_ManCleanLight( Ses_Man_t * pSes )
{
    int h, i;
    for ( h = 0; h < pSes->nSpecFunc; ++h )
        if ( ( pSes->bSpecInv >> h ) & 1 )
            for ( i = 0; i < 4; ++i )
                pSes->pSpec[(h << 2) + i] = ~( pSes->pSpec[(h << 2) + i] );

    if ( pSes->pArrTimeProfile )
        for ( i = 0; i < pSes->nSpecVars; ++i )
            pSes->pArrTimeProfile[i] += pSes->nArrTimeDelta;

    Vec_IntFree( pSes->vPolar );
    Vec_IntFree( pSes->vAssump );
    Vec_IntFree( pSes->vStairDecVars );

    ABC_FREE( pSes );
}